

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall spirv_cross::Compiler::is_tessellation_shader(Compiler *this)

{
  ExecutionModel EVar1;
  
  EVar1 = get_execution_model(this);
  return EVar1 - ExecutionModelTessellationControl < 2;
}

Assistant:

bool Compiler::is_tessellation_shader() const
{
	return is_tessellation_shader(get_execution_model());
}